

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<int&,int&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args,int *args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffaf0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffaf8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffb00;
  basic_appender<char> *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb38;
  level_enum in_stack_fffffffffffffb5c;
  log_msg *in_stack_fffffffffffffb60;
  string_view_t in_stack_fffffffffffffb68;
  string_view_t in_stack_fffffffffffffb78;
  source_loc in_stack_fffffffffffffb90;
  basic_string_view<char> local_418 [2];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  log_msg *local_3e8;
  buffer<char> *local_380;
  undefined4 local_378 [4];
  undefined4 local_368 [6];
  undefined8 local_350;
  undefined4 *local_348;
  undefined8 local_340;
  undefined8 local_338;
  basic_appender<char> local_330 [4];
  buffer<char> local_310 [9];
  undefined1 local_1ea;
  byte local_1e9;
  undefined4 *local_1e8;
  undefined4 *local_1e0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined4 *local_f8;
  undefined4 *local_f0;
  undefined4 local_e4;
  undefined4 *local_e0;
  undefined4 local_d4;
  undefined4 *local_d0;
  undefined4 *local_c8;
  undefined8 *local_c0;
  
  pcVar1 = &stack0x00000008;
  local_1e8 = in_R9;
  local_1e0 = in_R8;
  local_1c8 = in_RDX;
  local_1c0 = in_RCX;
  local_1e9 = should_log(in_stack_fffffffffffffaf8,
                         (level_enum)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
  local_1ea = details::backtracer::enabled((backtracer *)0x1a0c13);
  if (((local_1e9 & 1) != 0) || ((bool)local_1ea)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffaf0,(allocator<char> *)in_stack_fffffffffffffae8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_330,local_310);
    local_340 = local_1c8;
    local_338 = local_1c0;
    local_f0 = local_1e0;
    local_f8 = local_1e8;
    local_e4 = *local_1e0;
    local_e0 = local_378;
    local_d0 = local_368;
    local_d4 = *local_1e8;
    local_c0 = &local_350;
    local_c8 = local_378;
    local_350 = 0x11;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb34;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb30;
    args_00.field_1.args_ = in_stack_fffffffffffffb38.args_;
    local_378[0] = local_e4;
    local_368[0] = local_d4;
    local_348 = local_c8;
    local_380 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffb28,fmt_00,args_00);
    local_3e8 = *(log_msg **)(pcVar1 + 0x10);
    local_3f8 = *(undefined8 *)pcVar1;
    uStack_3f0 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_310);
    count = ::fmt::v11::detail::buffer<char>::size(local_310);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_418,pcVar1,count);
    uVar2 = uStack_3f0;
    log_msg_00 = local_3e8;
    details::log_msg::log_msg
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,in_stack_fffffffffffffb78,
               in_stack_fffffffffffffb5c,in_stack_fffffffffffffb68);
    log_it_(in_stack_fffffffffffffb00,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x1a0e7e);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }